

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O3

void initialize_random_artifacts(uint32_t randart_seed)

{
  _Bool **dest;
  artifact_upkeep *paVar1;
  bitflag *pbVar2;
  effect *effect1;
  effect *effect2;
  wchar_t wVar3;
  wchar_t wVar4;
  artifact *paVar5;
  char ***sections;
  _Bool _Var6;
  uint16_t uVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  ang_file *f;
  long lVar10;
  char *pcVar11;
  object_kind *poVar12;
  angband_constants *paVar13;
  wchar_t wVar14;
  int iVar15;
  int iVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  char *pcVar19;
  ulong uVar20;
  artifact *art;
  activation *paVar21;
  activation *paVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  char word [1024];
  char fname [1024];
  char buf [1024];
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  undefined1 local_c18 [16];
  undefined1 local_c08 [16];
  undefined1 local_bf8 [16];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined8 local_bc8;
  char local_838 [1024];
  char local_438 [1032];
  
  bVar23 = 0;
  Rand_quick = true;
  Rand_value = randart_seed;
  path_build(local_838,0x400,ANGBAND_DIR_USER,"randart.txt");
  f = file_open(local_838,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    quit_fmt("Error - can\'t create %s.",local_838);
  }
  file_putf(f,"# Artifact file for random artifacts with seed %08x\n\n\n",randart_seed);
  a_info = (artifact *)mem_realloc(a_info,(ulong)((uint)z_info->a_max * 0x140) + 0x3200);
  aup_info = (artifact_upkeep *)mem_realloc(aup_info,(ulong)z_info->a_max * 8 + 0x140);
  uVar7 = z_info->a_max;
  iVar15 = 0;
  do {
    paVar5 = a_info;
    art = (artifact *)(a_info->flags + ((ulong)((uint)uVar7 * 0x140) - 0x3c));
    memset(art,0,0x140);
    paVar1 = aup_info + z_info->a_max;
    paVar1->aidx = 0;
    paVar1->created = false;
    paVar1->seen = false;
    paVar1->everseen = false;
    paVar1->field_0x7 = 0;
    aup_info[z_info->a_max].aidx = (uint)z_info->a_max;
    memset(art,0,0x140);
    do {
      do {
        uVar8 = Rand_div((uint)z_info->k_max);
      } while (k_info[(int)uVar8].name == (char *)0x0);
      poVar12 = k_info + (int)uVar8;
    } while (((poVar12->alloc_prob == L'\0') || (_Var6 = tval_can_be_artifact_k(poVar12), !_Var6))
            || (uVar8 = Rand_div((uint32_t)(100 / (long)poVar12->alloc_prob)), uVar8 != 0));
    wVar9 = poVar12->sval;
    art->tval = poVar12->tval;
    art->sval = wVar9;
    wVar9 = (poVar12->to_d).base;
    wVar14 = (poVar12->to_h).base;
    auVar24._0_4_ = (uint)(wVar14 - (wVar14 >> 0x1f)) >> 1;
    auVar24._4_4_ = (uint)(wVar9 - (wVar9 >> 0x1f)) >> 1;
    auVar24._8_8_ = 0;
    auVar24 = pshuflw(auVar24,auVar24,0xe8);
    art->to_h = (short)auVar24._0_4_;
    art->to_d = (short)((uint)auVar24._0_4_ >> 0x10);
    wVar9 = (poVar12->to_a).base;
    art->to_a = (int16_t)((uint)(wVar9 - (wVar9 >> 0x1f)) >> 1);
    art->ac = (int16_t)poVar12->ac;
    art->dd = (uint8_t)poVar12->dd;
    art->ds = (uint8_t)poVar12->ds;
    if (L'ᎇ' < poVar12->cost) {
      art->cost = poVar12->cost;
    }
    art->weight = poVar12->weight;
    flag_copy(art->flags,poVar12->flags,6);
    lVar10 = 0;
    do {
      art->el_info[lVar10].res_level = poVar12->el_info[lVar10].res_level;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1c);
    lVar10 = 0;
    do {
      *(short *)((long)art->modifiers + lVar10) = (short)(&poVar12->modifiers[0].base)[lVar10 * 2];
      lVar10 = lVar10 + 2;
    } while (lVar10 != 0x22);
    copy_slays(&art->slays,poVar12->slays);
    dest = &art->brands;
    copy_brands(dest,poVar12->brands);
    if (z_info->act_max == 0) {
      paVar22 = (activation *)0x0;
    }
    else {
      effect1 = poVar12->effect;
      lVar10 = 0;
      uVar20 = 0;
      paVar13 = z_info;
      paVar22 = activations;
      do {
        effect2 = *(effect **)((long)&paVar22->effect + lVar10);
        paVar21 = paVar22;
        if ((effect2 != (effect *)0x0) &&
           (_Var6 = effect_equal(effect1,effect2), paVar13 = z_info, paVar21 = activations, !_Var6))
        {
          paVar22 = (activation *)((long)&paVar22->next + lVar10);
          goto LAB_0018aa01;
        }
        uVar20 = uVar20 + 1;
        lVar10 = lVar10 + 0x48;
        paVar22 = paVar21;
      } while (uVar20 < paVar13->act_max);
      paVar22 = (activation *)0x0;
    }
LAB_0018aa01:
    art->activation = paVar22;
    wVar9 = (poVar12->time).dice;
    wVar14 = (poVar12->time).sides;
    wVar18 = (poVar12->time).m_bonus;
    (art->time).base = (poVar12->time).base;
    (art->time).dice = wVar9;
    (art->time).sides = wVar14;
    (art->time).m_bonus = wVar18;
    lVar10 = 0;
    do {
      pbVar2 = &paVar5->el_info[lVar10].flags + (uint)uVar7 * 0x140;
      *pbVar2 = *pbVar2 | 2;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    potential = L'ۖ';
    iVar16 = 0xe;
    do {
      uVar8 = Rand_div(0xf);
      if ((int)uVar8 < 2) break;
      potential = potential + L'Ǵ';
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    wVar9 = poVar12->power;
    wVar14 = potential - wVar9;
    if (wVar14 < L'ۗ') {
      wVar14 = L'ۖ';
    }
    max_potential = poVar12->base->potential;
    if (max_potential <= wVar14) {
      wVar14 = max_potential;
    }
    potential = wVar14;
    initial_potential = wVar14;
    art->cost = art->cost + wVar14 * 10;
    wVar3 = wVar14 / 100;
    wVar18 = poVar12->alloc_min;
    wVar4 = wVar18;
    if (wVar18 < wVar3) {
      wVar4 = wVar3;
    }
    wVar17 = L'\x05';
    if (L'\x0e' < wVar4) {
      if (wVar3 < wVar18) {
        wVar17 = wVar18 + L'\xfffffff6';
      }
      else {
        wVar17 = wVar3 + L'\xfffffff6';
      }
    }
    art->alloc_min = wVar17;
    wVar18 = (wVar17 - wVar18) + poVar12->alloc_max;
    if (L'~' < wVar18) {
      wVar18 = L'\x7f';
    }
    art->alloc_max = wVar18;
    wVar9 = ((int)(10000 / (long)(wVar14 + wVar9)) * 100) / poVar12->alloc_prob;
    if (L'\x1d' < wVar9) {
      wVar9 = L'\x1e';
    }
    art->alloc_prob = wVar9;
    choose_artifact_theme(art);
    haggle_till_done(art,(object *)0x0);
    uVar8 = Rand_div(100);
    if ((int)uVar8 < 5) {
      make_terrible(art,(object *)0x0);
    }
    final_check(art,(object *)0x0);
    paVar22 = art->activation;
    wVar9 = art->tval;
    if ((paVar22 != (activation *)0x0) && (paVar22 != k_info[wVar9].activation)) {
      if ((paVar22->time).base == L'\0') {
        iVar16 = paVar22->power << 3;
        (art->time).base = iVar16;
        (art->time).dice = 1;
        (art->time).sides = iVar16;
      }
      else {
        wVar14 = (paVar22->time).dice;
        wVar18 = (paVar22->time).sides;
        wVar3 = (paVar22->time).m_bonus;
        (art->time).base = (paVar22->time).base;
        (art->time).dice = wVar14;
        (art->time).sides = wVar18;
        (art->time).m_bonus = wVar3;
      }
    }
    pcVar11 = "Random ";
    pcVar19 = local_c38;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)pcVar19 = *(undefined8 *)pcVar11;
      pcVar11 = pcVar11 + ((ulong)bVar23 * -2 + 1) * 8;
      pcVar19 = pcVar19 + (ulong)bVar23 * -0x10 + 8;
    }
    pcVar11 = tval_find_name(wVar9);
    my_strcat(local_c38,pcVar11,0x80);
    pcVar11 = format(" of power %d",(ulong)(uint)initial_potential);
    my_strcat(local_c38,pcVar11,0x80);
    string_free(art->text);
    pcVar11 = string_make(local_c38);
    art->text = pcVar11;
    sections = name_sections;
    wVar9 = Rand_div(max_potential);
    if ((wVar9 < initial_potential) && (uVar8 = Rand_div(2), uVar8 != 0)) {
      find_word_art_name[0] = 0;
      wVar9 = art->cost;
      _Var6 = tval_is_weapon_a(art);
      pcVar11 = "a_cursed.txt";
      if (_Var6) {
        pcVar11 = "w_cursed.txt";
      }
      pcVar19 = "a_normal.txt";
      if (_Var6) {
        pcVar19 = "w_normal.txt";
      }
      if (wVar9 == L'\0') {
        pcVar19 = pcVar11;
      }
      get_rnd_line(pcVar19,find_word_art_name);
      my_strcpy(local_c38,find_word_art_name,0x400);
      pcVar11 = local_c38;
    }
    else {
      randname_make(RANDNAME_TOLKIEN,5,9,local_c38,0x400,sections);
      my_strcap(local_c38);
      uVar8 = Rand_div(3);
      if (uVar8 == 0) {
        pcVar11 = "\'%s\'";
      }
      else {
        pcVar11 = "of %s";
      }
      pcVar11 = format(pcVar11,local_c38);
    }
    my_strcpy(local_438,pcVar11,0x400);
    pcVar11 = string_make(local_c38);
    art->name = pcVar11;
    art->aidx = (uint)z_info->a_max;
    local_bd8 = (undefined1  [16])0x0;
    local_be8 = (undefined1  [16])0x0;
    local_bf8 = (undefined1  [16])0x0;
    local_c08 = (undefined1  [16])0x0;
    local_c18 = (undefined1  [16])0x0;
    local_c28 = (undefined1  [16])0x0;
    local_c38 = (undefined1  [16])0x0;
    local_bc8 = 0;
    poVar12 = lookup_kind(art->tval,art->sval);
    if (art->name != (char *)0x0) {
      file_putf(f,"# %s\n",art->text);
      file_putf(f,"name:%s\n",art->name);
      object_short_name(local_c38,0x78,poVar12->name);
      pcVar11 = tval_find_name(art->tval);
      file_putf(f,"base-object:%s:%s\n",pcVar11,local_c38);
      if ((uint)z_info->ordinary_kind_max <= poVar12->kidx) {
        pcVar11 = attr_to_text(poVar12->d_attr);
        file_putf(f,"graphics:%c:%s\n",(ulong)(uint)poVar12->d_char,pcVar11);
      }
      file_putf(f,"level:%d\n",(ulong)(uint)art->level);
      file_putf(f,"weight:%d\n",(ulong)(uint)art->weight);
      file_putf(f,"cost:%d\n",(ulong)(uint)art->cost);
      file_putf(f,"alloc:%d:%d to %d\n",(ulong)(uint)art->alloc_prob,(ulong)(uint)art->alloc_min,
                (ulong)(uint)art->alloc_max);
      file_putf(f,"attack:%dd%d:%d:%d\n",(ulong)art->dd,(ulong)art->ds,(ulong)(uint)(int)art->to_h,
                (ulong)(uint)(int)art->to_d);
      file_putf(f,"armor:%d:%d\n",(ulong)(uint)(int)art->ac,(ulong)(uint)(int)art->to_a);
      write_flags(f,"flags:",art->flags,6,(char **)write_randart_file_entry_obj_flags);
      write_mods(f,art->modifiers);
      write_elements(f,art->el_info);
      if ((art->slays != (_Bool *)0x0) && (1 < z_info->slay_max)) {
        uVar20 = 1;
        lVar10 = 0x38;
        paVar13 = z_info;
        do {
          if (art->slays[uVar20] == true) {
            file_putf(f,"slay:%s\n",*(undefined8 *)((long)&slays->code + lVar10));
            paVar13 = z_info;
          }
          uVar20 = uVar20 + 1;
          lVar10 = lVar10 + 0x38;
        } while (uVar20 < paVar13->slay_max);
      }
      if ((*dest != (_Bool *)0x0) && (1 < z_info->brand_max)) {
        uVar20 = 1;
        lVar10 = 0x30;
        paVar13 = z_info;
        do {
          if ((*dest)[uVar20] == true) {
            file_putf(f,"brand:%s\n",*(undefined8 *)((long)&brands->code + lVar10));
            paVar13 = z_info;
          }
          uVar20 = uVar20 + 1;
          lVar10 = lVar10 + 0x30;
        } while (uVar20 < paVar13->brand_max);
      }
      if ((art->curses != (int *)0x0) && (1 < z_info->curse_max)) {
        uVar20 = 1;
        lVar10 = 0x10;
        paVar13 = z_info;
        do {
          if (art->curses[uVar20] != 0) {
            file_putf(f,"curse:%s:%d\n",*(undefined8 *)(curses->conflict_flags + lVar10 * 4 + -0x28)
                     );
            paVar13 = z_info;
          }
          uVar20 = uVar20 + 1;
          lVar10 = lVar10 + 0xe;
        } while (uVar20 < paVar13->curse_max);
      }
      if (art->activation == (activation *)0x0) {
        if (poVar12->activation != (activation *)0x0) {
          file_putf(f,"act:%s\n",poVar12->activation->name);
          wVar18 = (poVar12->time).base;
          wVar14 = (poVar12->time).dice;
          wVar9 = (poVar12->time).sides;
          goto LAB_0018b0f3;
        }
      }
      else {
        file_putf(f,"act:%s\n",art->activation->name);
        wVar18 = (art->time).base;
        wVar14 = (art->time).dice;
        wVar9 = (art->time).sides;
LAB_0018b0f3:
        file_putf(f,"time:%d+%dd%d\n",(ulong)(uint)wVar18,(ulong)(uint)wVar14,(ulong)(uint)wVar9);
      }
      file_putf(f,"desc:%s\n",art->text);
      file_putf(f,"\n");
    }
    uVar7 = z_info->a_max + 1;
    z_info->a_max = uVar7;
    iVar15 = iVar15 + 1;
    if (iVar15 == 0x28) {
      _Var6 = file_close(f);
      if (!_Var6) {
        quit_fmt("Error - can\'t close %s.",local_838);
      }
      return;
    }
  } while( true );
}

Assistant:

void initialize_random_artifacts(uint32_t randart_seed)
{
	char fname[1024];
	ang_file *randart_file = NULL;
	int i;

	/* Prepare to use the Angband "simple" RNG. */
	Rand_value = randart_seed;
	Rand_quick = true;

	/* Open the file, write a header */
	path_build(fname, sizeof(fname), ANGBAND_DIR_USER, "randart.txt");
	randart_file = file_open(fname, MODE_WRITE, FTYPE_TEXT);
	if (!randart_file) {
		quit_fmt("Error - can't create %s.", fname);
	}
	file_putf(randart_file,
			  "# Artifact file for random artifacts with seed %08x\n\n\n",
			  randart_seed);

	/* Initialize, name and write artifacts to the file */
	a_info = mem_realloc(a_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*a_info));
	aup_info = mem_realloc(aup_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*aup_info));
	for (i = 0; i < ART_NUM_RANDOM; i++) {
		/* Extend the artifact array with a zero entry */
		struct artifact *art;
		art = &a_info[z_info->a_max];
		memset(art, 0, sizeof(*art));
		memset(&aup_info[z_info->a_max], 0, sizeof(*aup_info));
		aup_info[z_info->a_max].aidx = z_info->a_max;

		/* Design the artifact, storing information as we go along. */
		design_random_artifact(art);
		art->aidx = z_info->a_max;

		/* Write the entry to the randart file */
		write_randart_file_entry(randart_file, art);

		z_info->a_max += 1;
	}

	/* Close the file */
	if (!file_close(randart_file)) {
		quit_fmt("Error - can't close %s.", fname);
	}
}